

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::insertfile(Fl_Text_Buffer *this,char *file,int pos,int buflen)

{
  bool bVar1;
  FILE *__stream;
  Fl_Text_Buffer *pFVar2;
  wchar_t wVar3;
  uint ucs;
  wchar_t wVar4;
  char *text;
  size_t sVar5;
  char *p;
  int pos_00;
  char *pcVar6;
  char *__dest;
  int iVar7;
  char *pcVar8;
  int lp;
  char multibyte [5];
  char line [100];
  wchar_t local_e4;
  char *local_e0;
  char *local_d8;
  FILE *local_d0;
  ulong local_c8;
  Fl_Text_Buffer *local_c0;
  char *local_b8;
  ulong local_b0;
  long local_a8;
  char local_9d [5];
  char local_98 [100];
  undefined1 local_34 [4];
  
  local_d0 = (FILE *)fl_fopen(file,"r");
  if (local_d0 == (FILE *)0x0) {
    return 1;
  }
  local_c8 = (ulong)(uint)pos;
  text = (char *)operator_new__((long)(buflen + 1));
  this->input_file_was_transcoded = 0;
  local_b8 = text + buflen;
  pcVar6 = local_98;
  local_d8 = text;
  local_c0 = this;
  local_b0 = (ulong)(uint)buflen;
  while (p = local_98, __dest = text, (int)local_b0 < 1) {
LAB_001d06ac:
    memmove(local_98,p,(long)pcVar6 - (long)p);
LAB_001d06bd:
    pcVar6 = pcVar6 + (long)(local_98 + -(long)p);
LAB_001d06c3:
    pFVar2 = local_c0;
    __stream = local_d0;
    iVar7 = (int)__dest - (int)text;
    if (iVar7 == 0) {
      iVar7 = ferror(local_d0);
      fclose(__stream);
      operator_delete__(text);
      if (((iVar7 == 0) && (pFVar2->input_file_was_transcoded != 0)) &&
         (pFVar2->transcoding_warning_action != (_func_void_Fl_Text_Buffer_ptr *)0x0)) {
        (*pFVar2->transcoding_warning_action)(pFVar2);
      }
      return (uint)(iVar7 != 0) * 2;
    }
    text[iVar7] = '\0';
    pos_00 = (int)local_c8;
    insert(local_c0,pos_00,text);
    local_c8 = (ulong)(uint)(pos_00 + iVar7);
  }
  do {
    if (pcVar6 <= p) {
      sVar5 = fread(local_98,1,100,local_d0);
      pcVar6 = local_98 + (int)sVar5;
      p = local_98;
      if ((int)sVar5 == 0) goto LAB_001d06c3;
    }
    wVar3 = fl_utf8len1(*p);
    if (pcVar6 < p + wVar3) {
      local_a8 = (long)wVar3;
      memmove(local_98,p,(long)pcVar6 - (long)p);
      pcVar6 = pcVar6 + (long)(local_98 + -(long)p);
      sVar5 = fread(pcVar6,1,(size_t)(local_34 + -(long)pcVar6),local_d0);
      local_e0 = pcVar6 + (int)sVar5;
      p = local_98;
      pcVar6 = local_e0;
      text = local_d8;
      if ((long)local_e0 - (long)p < local_a8) goto LAB_001d06ac;
    }
    local_e0 = pcVar6;
    pcVar8 = __dest;
    if (L'\0' < wVar3) {
      do {
        ucs = fl_utf8decode(p,p + (uint)wVar3,&local_e4);
        wVar4 = fl_utf8encode(ucs,local_9d);
        pcVar6 = local_e0;
        if ((local_e4 != wVar3) || (wVar4 != wVar3)) {
          local_c0->input_file_was_transcoded = 1;
        }
        pcVar8 = __dest + wVar4;
        if (local_b8 < pcVar8) {
          memmove(local_98,p,(long)local_e0 - (long)p);
          text = local_d8;
          goto LAB_001d06bd;
        }
        memcpy(__dest,local_9d,(long)wVar4);
        p = p + local_e4;
        wVar4 = wVar3 - local_e4;
        bVar1 = local_e4 <= wVar3;
        __dest = pcVar8;
        wVar3 = wVar4;
      } while (wVar4 != L'\0' && bVar1);
    }
    pcVar6 = local_e0;
    text = local_d8;
    __dest = pcVar8;
    if (local_b8 <= pcVar8) goto LAB_001d06ac;
  } while( true );
}

Assistant:

int Fl_Text_Buffer::insertfile(const char *file, int pos, int buflen)
{
  FILE *fp;
  if (!(fp = fl_fopen(file, "r")))
    return 1;
  char *buffer = new char[buflen + 1];  
  char *endline, line[100];
  int l;
  input_file_was_transcoded = false;
  endline = line;
  while (true) {
#ifdef EXAMPLE_ENCODING
    // example of 16-bit encoding: UTF-16
    l = general_input_filter(buffer, buflen, 
				  line, sizeof(line), endline, 
				  utf16toucs, // use cp1252toucs to read CP1252-encoded files
				  fp);
    input_file_was_transcoded = true;
#else
    l = utf8_input_filter(buffer, buflen, line, sizeof(line), endline, 
			  fp, &input_file_was_transcoded);
#endif
    if (l == 0) break;
    buffer[l] = 0;
    insert(pos, buffer);
    pos += l;
  }
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  delete[]buffer;
  if ( (!e) && input_file_was_transcoded && transcoding_warning_action) {
    transcoding_warning_action(this);
  }
  return e;
}